

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->targetsize_);
  if (sVar1 == 0) {
    lVar4 = 0;
  }
  else {
    uVar3 = (long)(int)sVar1 | 1;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    lVar4 = (ulong)((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  (this->_targetsize_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar1;
  sVar1 = lVar4 + sVar1;
  if (this->mode_ != (SamplingMode *)0x0 &&
      this != (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::SamplingMode>(this->mode_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  if (this->boxindicesmode_ != (BoxCoordinatesMode *)0x0 &&
      this != (CropResizeLayerParams *)_CropResizeLayerParams_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BoxCoordinatesMode>(this->boxindicesmode_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  sVar2 = sVar1 + 2;
  if (this->normalizedcoordinates_ == false) {
    sVar2 = sVar1;
  }
  sVar1 = sVar2 + 5;
  if (this->spatialscale_ == 0.0) {
    sVar1 = sVar2;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar1 = sVar1 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar1;
  return sVar1;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _targetsize_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->_internal_has_mode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->_internal_has_boxindicesmode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->_internal_normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_spatialscale = this->_internal_spatialscale();
  uint32_t raw_spatialscale;
  memcpy(&raw_spatialscale, &tmp_spatialscale, sizeof(tmp_spatialscale));
  if (raw_spatialscale != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}